

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O2

t_gotfn zgetfn(t_pd *x,t_symbol *s)

{
  t_gotfn *pp_Var1;
  int iVar2;
  bool bVar3;
  
  iVar2 = (*x)->c_nmethod;
  pp_Var1 = &(*x)->c_methods->me_fun;
  while( true ) {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      return (t_gotfn)0x0;
    }
    if (((t_methodentry *)(pp_Var1 + -1))->me_name == s) break;
    pp_Var1 = pp_Var1 + 3;
  }
  return *pp_Var1;
}

Assistant:

t_gotfn zgetfn(const t_pd *x, t_symbol *s)
{
    const t_class *c = *x;
    t_methodentry *m, *mlist;
    int i;

#ifdef PDINSTANCE
    mlist = c->c_methods[pd_this->pd_instanceno];
#else
    mlist = c->c_methods;
#endif
    for (i = c->c_nmethod, m = mlist; i--; m++)
        if (m->me_name == s) return(m->me_fun);
    return(0);
}